

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealBox.cpp
# Opt level: O2

void __thiscall amrex::RealBox::RealBox(RealBox *this,Box *bx,Real *dx,Real *base)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = (bx->btype).itype;
  for (lVar2 = -3; lVar2 != 0; lVar2 = lVar2 + 1) {
    this->xhi[lVar2] = (double)(bx->bigend).vect[lVar2] * dx[lVar2 + 3] + base[lVar2 + 3];
    this[1].xlo[lVar2] =
         (double)(int)(((IndexType *)(&bx->bigend + 1))[lVar2].itype +
                      (uint)((~uVar1 >> ((int)lVar2 + 3U & 0x1f) & 1) != 0)) * dx[lVar2 + 3] +
         base[lVar2 + 3];
  }
  return;
}

Assistant:

RealBox::RealBox (const Box&  bx,
                  const Real* dx,
                  const Real* base) noexcept
{
    const int* blo = bx.loVect();
    const int* bhi = bx.hiVect();
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        xlo[i] = base[i] + dx[i]*blo[i];
        int shft = (bx.type(i) == IndexType::CELL ? 1 : 0);
        xhi[i] = base[i] + dx[i]*(bhi[i]+ shft);
    }
}